

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfPost.c
# Opt level: O3

void Cnf_ManPostprocess(Cnf_Man_t *p)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  void **ppvVar4;
  void *pvVar5;
  Cnf_Cut_t *pCut;
  void *pvVar6;
  Cnf_Cut_t *pCutFan;
  bool bVar7;
  Vec_Ptr_t *pVVar8;
  Cnf_Cut_t *pCutRes;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int Order [16];
  int Costs [16];
  int local_b8 [16];
  int aiStack_78 [18];
  
  pVVar8 = p->pManAig->vObjs;
  uVar9 = (ulong)(uint)pVVar8->nSize;
  if (0 < pVVar8->nSize) {
    lVar13 = 0;
    do {
      ppvVar4 = pVVar8->pArray;
      pvVar5 = ppvVar4[lVar13];
      if (((pvVar5 != (void *)0x0) && ((*(ulong *)((long)pvVar5 + 0x18) & 0xffffffc0) != 0)) &&
         (0xfffffffd < ((uint)*(ulong *)((long)pvVar5 + 0x18) & 7) - 7)) {
        pCut = *(Cnf_Cut_t **)((long)pvVar5 + 0x28);
        cVar1 = pCut->nFanins;
        if ('\0' < cVar1) {
          uVar11 = 0;
          do {
            iVar12 = *(int *)((long)pCut[1].vIsop + uVar11 * 4 + -8);
            if (((long)iVar12 < 0) || ((int)uVar9 <= iVar12)) goto LAB_0056453e;
            pvVar6 = ppvVar4[iVar12];
            if (pvVar6 == (void *)0x0) break;
            local_b8[uVar11] = (int)uVar11;
            iVar12 = 0;
            if (0xfffffffd < (*(uint *)((long)pvVar6 + 0x18) & 7) - 7) {
              iVar12 = (int)*(char *)(*(long *)((long)pvVar6 + 0x28) + 1);
            }
            aiStack_78[uVar11] = iVar12;
            uVar11 = uVar11 + 1;
          } while ((uint)(int)cVar1 != uVar11);
        }
        if ('\x01' < cVar1) {
          do {
            uVar9 = 0;
            bVar7 = false;
            iVar12 = local_b8[0];
            do {
              iVar2 = local_b8[uVar9 + 1];
              if (aiStack_78[iVar2] < aiStack_78[iVar12]) {
                local_b8[uVar9] = iVar2;
                local_b8[uVar9 + 1] = iVar12;
                bVar7 = true;
                iVar2 = iVar12;
              }
              iVar12 = iVar2;
              uVar9 = uVar9 + 1;
            } while ((int)cVar1 - 1 != uVar9);
          } while ((bVar7) && ('\x01' < cVar1));
        }
        if ('\0' < cVar1) {
          lVar10 = 0;
          do {
            pVVar8 = p->pManAig->vObjs;
            if (pVVar8 == (Vec_Ptr_t *)0x0) break;
            uVar3 = *(uint *)((long)pCut[1].vIsop + (long)local_b8[lVar10] * 4 + -8);
            if (((int)uVar3 < 0) || (pVVar8->nSize <= (int)uVar3)) {
LAB_0056453e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar6 = pVVar8->pArray[uVar3];
            if (pvVar6 == (void *)0x0) break;
            uVar3 = *(uint *)((long)pvVar6 + 0x18);
            if (0xfffffffd < (uVar3 & 7) - 7) {
              if (uVar3 < 0x40) {
                __assert_fail("pFan->nRefs != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfPost.c"
                              ,0xcc,"void Cnf_ManPostprocess(Cnf_Man_t *)");
              }
              if ((uVar3 & 0xffffffc0) == 0x40) {
                pCutFan = *(Cnf_Cut_t **)((long)pvVar6 + 0x28);
                pCutRes = Cnf_CutCompose(p,pCut,pCutFan,*(int *)((long)pvVar6 + 0x24));
                if (pCutRes != (Cnf_Cut_t *)0x0) {
                  if ((pCutRes->Cost != 0x7f) &&
                     ((int)pCutRes->Cost <= (int)pCutFan->Cost + (int)pCut->Cost)) {
                    *(Cnf_Cut_t **)((long)pvVar5 + 0x28) = pCutRes;
                    *(undefined8 *)((long)pvVar6 + 0x28) = 0;
                    Cnf_CutUpdateRefs(p,pCut,pCutFan,pCutRes);
                    if ((*(uint *)((long)pvVar6 + 0x18) & 0xffffffc0) != 0) {
                      __assert_fail("pFan->nRefs == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfPost.c"
                                    ,0xe0,"void Cnf_ManPostprocess(Cnf_Man_t *)");
                    }
                    Cnf_CutFree(pCut);
                    Cnf_CutFree(pCutFan);
                    break;
                  }
                  Cnf_CutFree(pCutRes);
                }
              }
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < pCut->nFanins);
        }
      }
      lVar13 = lVar13 + 1;
      pVVar8 = p->pManAig->vObjs;
      uVar9 = (ulong)pVVar8->nSize;
    } while (lVar13 < (long)uVar9);
  }
  return;
}

Assistant:

void Cnf_ManPostprocess( Cnf_Man_t * p )
{
    Cnf_Cut_t * pCut, * pCutFan, * pCutRes;
    Aig_Obj_t * pObj, * pFan;
    int Order[16], Costs[16];
    int i, k, fChanges;
    Aig_ManForEachNode( p->pManAig, pObj, i )
    {
        if ( pObj->nRefs == 0 )
            continue;
        pCut = Cnf_ObjBestCut(pObj);

        // sort fanins according to their size
        Cnf_CutForEachLeaf( p->pManAig, pCut, pFan, k )
        {
            Order[k] = k;
            Costs[k] = Aig_ObjIsNode(pFan)? Cnf_ObjBestCut(pFan)->Cost : 0;
        }
        // sort the cuts by Weight
        do {
            int Temp;
            fChanges = 0;
            for ( k = 0; k < pCut->nFanins - 1; k++ )
            {
                if ( Costs[Order[k]] <= Costs[Order[k+1]] )
                    continue;
                Temp = Order[k];
                Order[k] = Order[k+1];
                Order[k+1] = Temp;
                fChanges = 1;
            }
        } while ( fChanges );


//        Cnf_CutForEachLeaf( p->pManAig, pCut, pFan, k )
        for ( k = 0; (k < (int)(pCut)->nFanins) && ((pFan) = Aig_ManObj(p->pManAig, (pCut)->pFanins[Order[k]])); k++ )
        {
            if ( !Aig_ObjIsNode(pFan) )
                continue;
            assert( pFan->nRefs != 0 );
            if ( pFan->nRefs != 1 )
                continue;
            pCutFan = Cnf_ObjBestCut(pFan);
            // try composing these two cuts
//            Cnf_CutPrint( pCut );
            pCutRes = Cnf_CutCompose( p, pCut, pCutFan, pFan->Id );
//            Cnf_CutPrint( pCut );
//            printf( "\n" );
            // check if the cost if reduced
            if ( pCutRes == NULL || pCutRes->Cost == 127 || pCutRes->Cost > pCut->Cost + pCutFan->Cost )
            {
                if ( pCutRes )
                    Cnf_CutFree( pCutRes );
                continue;
            }
            // update the cut
            Cnf_ObjSetBestCut( pObj, pCutRes );
            Cnf_ObjSetBestCut( pFan, NULL );
            Cnf_CutUpdateRefs( p, pCut, pCutFan, pCutRes );
            assert( pFan->nRefs == 0 );
            Cnf_CutFree( pCut );
            Cnf_CutFree( pCutFan );
            break;
        }
    }
}